

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles31::Functional::createDrawBuffersIndexedTests(Context *context)

{
  Context *pCVar1;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar2;
  deUint32 dVar3;
  TestCaseGroup *pTVar4;
  TestCaseGroup *this;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCase *pTVar5;
  int iVar6;
  Maybe<bool> local_108;
  TestCaseGroup *local_f8;
  string local_f0;
  Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
  local_d0;
  Maybe<tcu::Vector<bool,_4>_> local_a8;
  BlendState emptyState;
  
  local_108.m_ptr = (bool *)0x0;
  local_f0._M_dataplus._M_p = (char *)0x0;
  local_d0.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  local_a8.m_ptr = (Vector<bool,_4> *)0x0;
  anon_unknown_0::BlendState::BlendState
            (&emptyState,&local_108,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)&local_f0,&local_d0,&local_a8);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,context,"draw_buffers_indexed",
             "Test for indexed draw buffers. GL_EXT_draw_buffers_indexed.");
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,context,"overwrite_common",
             "Set common state and overwrite it with draw buffer blend state.");
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,context,"overwrite_indexed",
             "Set indexed blend state and overwrite it with common state.");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this_01,context,"random","Random indexed blend state tests.");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,context,"max_required_draw_buffers",
             "Random tests using minimum maximum number of draw buffers.");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,context,"max_implementation_draw_buffers",
             "Random tests using maximum number of draw buffers reported by implementation.");
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_03);
  anon_unknown_0::addDrawBufferCommonTests(this,PRE);
  anon_unknown_0::addDrawBufferCommonTests(this_00,POST);
  local_f8 = pTVar4;
  for (iVar6 = 0; iVar6 != 0x14; iVar6 = iVar6 + 1) {
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar1 = this_02->m_context;
    local_108.m_ptr = (bool *)CONCAT44(local_108.m_ptr._4_4_,iVar6);
    de::toString<int>((string *)&local_d0,(int *)&local_108);
    pEVar2 = local_d0.m_ptr;
    de::toString<int>(&local_f0,(int *)&local_108);
    gles31::TestCase::TestCase(pTVar5,pCVar1,&pEVar2->m_isFirst,local_f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e61ab0;
    dVar3 = ::deInt32Hash((deInt32)local_108.m_ptr);
    *(deUint32 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = dVar3 ^ 0x5cdd369b;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pTVar5);
  }
  for (iVar6 = 0; pTVar4 = local_f8, iVar6 != 0x14; iVar6 = iVar6 + 1) {
    pTVar5 = (TestCase *)operator_new(0x80);
    pCVar1 = this_03->m_context;
    local_108.m_ptr = (bool *)CONCAT44(local_108.m_ptr._4_4_,iVar6);
    de::toString<int>((string *)&local_d0,(int *)&local_108);
    pEVar2 = local_d0.m_ptr;
    de::toString<int>(&local_f0,(int *)&local_108);
    gles31::TestCase::TestCase(pTVar5,pCVar1,&pEVar2->m_isFirst,local_f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    (pTVar5->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e61b00;
    dVar3 = ::deInt32Hash((deInt32)local_108.m_ptr);
    *(deUint32 *)&pTVar5[1].super_TestCase.super_TestNode._vptr_TestNode = dVar3 ^ 0xa01decda;
    tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)pTVar5);
  }
  anon_unknown_0::BlendState::~BlendState(&emptyState);
  return pTVar4;
}

Assistant:

TestCaseGroup* createDrawBuffersIndexedTests (Context& context)
{
	const BlendState		emptyState		= BlendState(Maybe<bool>(), Maybe<Either<BlendEq, SeparateBlendEq> >(), Maybe<Either<BlendFunc, SeparateBlendFunc> >(), Maybe<BVec4>());
	TestCaseGroup* const	group			= new TestCaseGroup(context, "draw_buffers_indexed", "Test for indexed draw buffers. GL_EXT_draw_buffers_indexed.");

	TestCaseGroup* const	preGroup		= new TestCaseGroup(context, "overwrite_common", "Set common state and overwrite it with draw buffer blend state.");
	TestCaseGroup* const	postGroup		= new TestCaseGroup(context, "overwrite_indexed", "Set indexed blend state and overwrite it with common state.");
	TestCaseGroup* const	randomGroup		= new TestCaseGroup(context, "random", "Random indexed blend state tests.");
	TestCaseGroup* const	maxGroup		= new TestCaseGroup(context, "max_required_draw_buffers", "Random tests using minimum maximum number of draw buffers.");
	TestCaseGroup* const	maxImplGroup	= new TestCaseGroup(context, "max_implementation_draw_buffers", "Random tests using maximum number of draw buffers reported by implementation.");

	group->addChild(preGroup);
	group->addChild(postGroup);
	group->addChild(randomGroup);

	randomGroup->addChild(maxGroup);
	randomGroup->addChild(maxImplGroup);

	addDrawBufferCommonTests(preGroup, PRE);
	addDrawBufferCommonTests(postGroup, POST);
	addRandomMaxTest(maxGroup);
	addRandomImplMaxTest(maxImplGroup);

	return group;
}